

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O3

Aig_Obj_t * Aig_CreateExor(Aig_Man_t *p,int nVars)

{
  Aig_Obj_t *p1;
  int i;
  Aig_Obj_t *p0;
  
  p0 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
  if (0 < nVars) {
    i = 0;
    do {
      p1 = Aig_IthVar(p,i);
      p0 = Aig_Exor(p,p0,p1);
      i = i + 1;
    } while (nVars != i);
  }
  return p0;
}

Assistant:

Aig_Obj_t * Aig_CreateExor( Aig_Man_t * p, int nVars )
{
    Aig_Obj_t * pFunc;
    int i;
    pFunc = Aig_ManConst0( p );
    for ( i = 0; i < nVars; i++ )
        pFunc = Aig_Exor( p, pFunc, Aig_IthVar(p, i) );
    return pFunc;
}